

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwttests.c
# Opt level: O3

double absmax(double *array,int N)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  if (0 < N) {
    uVar1 = 0;
    dVar3 = 0.0;
    do {
      uVar2 = -(ulong)(dVar3 <= ABS(array[uVar1]));
      dVar3 = (double)(~uVar2 & (ulong)dVar3 | (ulong)ABS(array[uVar1]) & uVar2);
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
    return dVar3;
  }
  return 0.0;
}

Assistant:

double absmax(double *array, int N) {
	double max;
	int i;

	max = 0.0;
	for (i = 0; i < N; ++i) {
		if (fabs(array[i]) >= max) {
			max = fabs(array[i]);
		}
	}

	return max;
}